

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::setupTags(TranslateToFuzzReader *this)

{
  Module *pMVar1;
  bool bVar2;
  Index IVar3;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *this_00;
  Name *pNVar4;
  pointer pTVar5;
  __uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> _Var6;
  Name name;
  Name name_00;
  Name local_150;
  Name local_140;
  Type local_130;
  Type local_128;
  Signature local_120;
  HeapType local_110;
  string_view local_108;
  string_view local_f8;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_e8;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> jsTag;
  Type local_d8;
  Type externref;
  Name local_b0;
  Type local_a0;
  Type local_98;
  Signature local_90;
  HeapType local_80;
  string_view local_78;
  string_view local_68;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> local_58;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> wasmTag;
  size_t i;
  undefined1 local_40 [4];
  Index num;
  reference local_30;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *__range1;
  TranslateToFuzzReader *this_local;
  
  this_00 = &this->wasm->tags;
  __end1 = std::
           vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ::begin(this_00);
  tag = (unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *)
        std::
        vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
                                     *)&tag), bVar2) {
    local_30 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
               ::operator*(&__end1);
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(local_30);
    bVar2 = Importable::imported(&pTVar5->super_Importable);
    if ((bVar2) && ((this->preserveImportsAndExports & 1U) == 0)) {
      Name::Name((Name *)local_40);
      pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(local_30);
      pNVar4 = Name::operator=(&(pTVar5->super_Importable).base,(Name *)local_40);
      pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(local_30);
      Name::operator=(&(pTVar5->super_Importable).module,pNVar4);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_*,_std::vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>_>
    ::operator++(&__end1);
  }
  IVar3 = upTo(this,3);
  for (wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
       super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
            (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
            (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0;
      _Var6.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
      super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._4_4_ = 0,
      _Var6.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
      super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl._0_4_ = IVar3,
      (ulong)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl <
      (ulong)_Var6.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
      super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
           ((long)wasmTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                  _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 1)) {
    addTag(this);
  }
  if (((this->preserveImportsAndExports & 1U) == 0) && (bVar2 = oneIn(this,2), bVar2)) {
    pMVar1 = this->wasm;
    Name::Name((Name *)&local_78,"wasmtag");
    local_68 = (string_view)Names::getValidTagName(pMVar1,(Name)local_78);
    Type::Type(&local_98,i32);
    Type::Type(&local_a0,none);
    Signature::Signature(&local_90,local_98,local_a0);
    wasm::HeapType::HeapType(&local_80,local_90);
    name.super_IString.str._M_str = (char *)local_68._M_len;
    name.super_IString.str._M_len = (size_t)&local_58;
    Builder::makeTag(name,(HeapType)local_68._M_str);
    Name::Name(&local_b0,"fuzzing-support");
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    Name::operator=(&(pTVar5->super_Importable).module,&local_b0);
    Name::Name((Name *)&externref,"wasmtag");
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_58);
    Name::operator=(&(pTVar5->super_Importable).base,(Name *)&externref);
    wasm::Module::addTag((unique_ptr *)this->wasm);
    HeapType::HeapType((HeapType *)&jsTag,ext);
    Type::Type(&local_d8,
               (HeapType)
               jsTag._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
               super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,Nullable,Inexact);
    pMVar1 = this->wasm;
    Name::Name((Name *)&local_108,"jstag");
    local_f8 = (string_view)Names::getValidTagName(pMVar1,(Name)local_108);
    local_128.id = local_d8.id;
    Type::Type(&local_130,none);
    Signature::Signature(&local_120,local_128,local_130);
    wasm::HeapType::HeapType(&local_110,local_120);
    name_00.super_IString.str._M_str = (char *)local_f8._M_len;
    name_00.super_IString.str._M_len = (size_t)&local_e8;
    Builder::makeTag(name_00,(HeapType)local_f8._M_str);
    Name::Name(&local_140,"fuzzing-support");
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_e8);
    Name::operator=(&(pTVar5->super_Importable).module,&local_140);
    Name::Name(&local_150,"jstag");
    pTVar5 = std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::operator->(&local_e8);
    Name::operator=(&(pTVar5->super_Importable).base,&local_150);
    wasm::Module::addTag((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_e8);
    std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>::~unique_ptr(&local_58);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTags() {
  // As in modifyInitialFunctions(), we can't allow arbitrary tag imports, which
  // would trap when the fuzzing infrastructure doesn't know what to provide.
  for (auto& tag : wasm.tags) {
    if (tag->imported() && !preserveImportsAndExports) {
      tag->module = tag->base = Name();
    }
  }

  // Add some random tags.
  Index num = upTo(3);
  for (size_t i = 0; i < num; i++) {
    addTag();
  }

  // Add the fuzzing support tags manually sometimes.
  if (!preserveImportsAndExports && oneIn(2)) {
    auto wasmTag = builder.makeTag(Names::getValidTagName(wasm, "wasmtag"),
                                   Signature(Type::i32, Type::none));
    wasmTag->module = "fuzzing-support";
    wasmTag->base = "wasmtag";
    wasm.addTag(std::move(wasmTag));

    auto externref = Type(HeapType::ext, Nullable);
    auto jsTag = builder.makeTag(Names::getValidTagName(wasm, "jstag"),
                                 Signature(externref, Type::none));
    jsTag->module = "fuzzing-support";
    jsTag->base = "jstag";
    wasm.addTag(std::move(jsTag));
  }
}